

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

CompileInfo * __thiscall cmTarget::GetCompileInfo(cmTarget *this,string *config)

{
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>,_bool>
  pVar2;
  allocator local_99;
  string msg;
  string config_upper;
  CompileInfo info;
  
  if (this->IsImportedTarget == false) {
    if ((int)this->TargetTypeValue < 5) {
      config_upper._M_dataplus._M_p = (pointer)&config_upper.field_2;
      config_upper._M_string_length = 0;
      config_upper.field_2._M_local_buf[0] = '\0';
      if (config->_M_string_length != 0) {
        cmsys::SystemTools::UpperCase(&msg,config);
        std::__cxx11::string::operator=((string *)&config_upper,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
      }
      iVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>_>_>
              ::find(&(((this->Internal).Pointer)->CompileInfoMap)._M_t,&config_upper);
      if ((_Rb_tree_header *)iVar1._M_node ==
          &(((this->Internal).Pointer)->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header) {
        info.CompilePdbDir._M_dataplus._M_p = (pointer)&info.CompilePdbDir.field_2;
        info.CompilePdbDir._M_string_length = 0;
        info.CompilePdbDir.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string((string *)&msg,"COMPILE_PDB",&local_99);
        ComputePDBOutputDir(this,&msg,config,&info.CompilePdbDir);
        std::__cxx11::string::~string((string *)&msg);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget::CompileInfo_&,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>
                    *)&msg,&config_upper,&info);
        pVar2 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::CompileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::CompileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::CompileInfo>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmTarget::CompileInfo>&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::CompileInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::CompileInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::CompileInfo>>>
                            *)&((this->Internal).Pointer)->CompileInfoMap,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>
                            *)&msg);
        iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::CompileInfo>
                 *)&msg);
        std::__cxx11::string::~string((string *)&info);
      }
      std::__cxx11::string::~string((string *)&config_upper);
      return (CompileInfo *)(iVar1._M_node + 2);
    }
    std::__cxx11::string::string
              ((string *)&msg,"cmTarget::GetCompileInfo called for ",(allocator *)&config_upper);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::append((char *)&msg);
    GetTargetTypeName(this->TargetTypeValue);
    std::__cxx11::string::append((char *)&msg);
    cmMakefile::IssueMessage(this->Makefile,INTERNAL_ERROR,&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  return (CompileInfo *)0x0;
}

Assistant:

cmTarget::CompileInfo const* cmTarget::GetCompileInfo(
                                            const std::string& config) const
{
  // There is no compile information for imported targets.
  if(this->IsImported())
    {
    return 0;
    }

  if(this->GetType() > cmTarget::OBJECT_LIBRARY)
    {
    std::string msg = "cmTarget::GetCompileInfo called for ";
    msg += this->GetName();
    msg += " which has type ";
    msg += cmTarget::GetTargetTypeName(this->GetType());
    this->GetMakefile()->IssueMessage(cmake::INTERNAL_ERROR, msg);
    return 0;
    }

  // Lookup/compute/cache the compile information for this configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  typedef cmTargetInternals::CompileInfoMapType CompileInfoMapType;
  CompileInfoMapType::const_iterator i =
    this->Internal->CompileInfoMap.find(config_upper);
  if(i == this->Internal->CompileInfoMap.end())
    {
    CompileInfo info;
    this->ComputePDBOutputDir("COMPILE_PDB", config, info.CompilePdbDir);
    CompileInfoMapType::value_type entry(config_upper, info);
    i = this->Internal->CompileInfoMap.insert(entry).first;
    }
  return &i->second;
}